

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O3

void generate_convert_field
               (dill_stream c,ConvStatus conv_status,dill_reg src_addr,size_t src_offset,
               dill_reg dest_addr,size_t dest_offset,dill_reg rt_conv_status,IOconvFieldStruct *conv
               ,FMTypeDesc *type_desc,int data_already_copied)

{
  short sVar1;
  short sVar2;
  FMdata_type FVar3;
  uint size;
  FMTypeEnum FVar4;
  undefined8 uVar5;
  int *piVar6;
  jmp_data *pjVar7;
  _FMgetFieldStruct src;
  _FMgetFieldStruct tmp_spec_00;
  _FMgetFieldStruct src_00;
  iogen_oprnd src_oprnd;
  iogen_oprnd oprnd;
  iogen_oprnd src_oprnd_00;
  iogen_oprnd oprnd_00;
  iogen_oprnd src_01;
  iogen_oprnd oprnd_01;
  undefined1 auVar8 [24];
  undefined1 uVar9;
  dill_reg src_addr_00;
  uint uVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  jmp_table pjVar19;
  char *pcVar20;
  ssize_t sVar21;
  dill_stream s;
  dill_reg new_src;
  conv_routine p_Var22;
  FMTypeDesc *pFVar23;
  ulong uVar24;
  arith_op3i *pp_Var25;
  dill_reg new_dest;
  size_t dest_offset_00;
  long lVar26;
  bool bVar27;
  _FMgetFieldStruct tmp_spec;
  dill_reg actual_dest_reg;
  dill_reg actual_src_reg;
  undefined4 uVar28;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff1c;
  dill_reg dVar29;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  iogen_oprnd local_b8;
  size_t local_90;
  ulong local_88;
  long local_80;
  undefined4 local_74;
  ulong local_70;
  uint uStack_68;
  FMdata_type FStack_64;
  undefined8 local_60;
  iogen_oprnd local_58;
  
  switch(type_desc->type) {
  case FMType_pointer:
    local_b8.offset._0_1_ = (conv->src_field).byte_swap;
    local_b8.offset._1_1_ = (conv->src_field).src_float_format;
    local_b8.offset._2_1_ = (conv->src_field).target_float_format;
    local_b8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    local_b8._0_8_ = (conv->src_field).offset;
    local_b8.size = (conv->src_field).size;
    local_b8._12_4_ = (conv->src_field).data_type;
    dVar29 = rt_conv_status;
    local_90 = src_offset;
    iVar13 = dill_alloc_label(c,0);
    local_b8.address = 0;
    local_b8.data_type = unknown_type;
    local_b8.size = conv_status->src_pointer_size;
    auVar8._4_4_ = local_b8._12_4_;
    auVar8._0_4_ = conv_status->src_pointer_size;
    auVar8._8_4_ = (int)local_b8.offset;
    auVar8._12_4_ = (int)(local_b8.offset >> 0x20);
    auVar8._16_8_ = 0;
    gen_convert_address_field
              (c,(_FMgetFieldStruct)(auVar8 << 0x40),src_addr,(dill_reg)local_90,
               (long)conv_status->target_pointer_size,conv_status->src_offset_adjust,rt_conv_status,
               (size_t)&local_58,(size_t)&local_70,conv_status->register_args,
               CONCAT44(in_stack_ffffffffffffff1c,iVar13),(dill_reg *)CONCAT44(dVar29,dest_addr),
               (dill_reg *)dest_offset,(int)conv,iVar13);
    iVar17 = dill_getreg(c,8);
    src_addr_00 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,src_addr_00,local_58.address);
    iVar18 = (int)local_70;
    (*c->j->mov)(c,8,0,iVar17,(int)local_70);
    generate_convert_field
              (c,conv_status,src_addr_00,0,iVar17,0,dVar29,conv,type_desc->next,
               (uint)(conv_status->global_conv->conversion_type == direct_to_mem));
    dill_mark_label(c,iVar13);
    pjVar19 = c->j;
    iVar13 = 8;
    break;
  case FMType_array:
    if (conv->rc_swap != no_row_column_swap) {
      local_b8.offset._0_1_ = (conv->src_field).byte_swap;
      local_b8.offset._1_1_ = (conv->src_field).src_float_format;
      local_b8.offset._2_1_ = (conv->src_field).target_float_format;
      local_b8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
      local_b8._0_8_ = (conv->src_field).offset;
      local_b8.size = (conv->src_field).size;
      local_b8._12_4_ = (conv->src_field).data_type;
      local_80 = CONCAT71(local_80._1_7_,conv->rc_swap == swap_source_column_major);
      iVar18 = conv->iovar->dimen_count;
      FVar3 = (conv->src_field).data_type;
      local_90 = src_offset;
      iVar13 = dill_getreg(c,8);
      iVar17 = dill_getreg(c,4);
      iVar14 = dill_getreg(c,8);
      local_88 = (long)iVar18 << 2;
      uVar12 = dill_getvblock(c,local_88 & 0xffffffff);
      local_74 = dill_getvblock(c,0x18);
      dill_virtual_lea(c,iVar13,uVar12);
      dill_virtual_lea(c,iVar14,local_74);
      if (type_desc->type == FMType_array) {
        lVar26 = 0;
        do {
          if ((long)type_desc->static_size == 0) {
            (*c->j->loadi)(c,4,0,iVar17,*(int *)&conv_status->control_value,
                           (long)type_desc->control_field_index << 2);
          }
          else {
            (*c->j->set)(c,4,0,iVar17,(long)type_desc->static_size);
          }
          (*c->j->storei)(c,4,0,iVar17,iVar13,lVar26);
          type_desc = type_desc->next;
          lVar26 = lVar26 + 4;
        } while (type_desc->type == FMType_array);
      }
      uVar9 = (undefined1)local_80;
      (*c->j->set)(c,4,0,iVar17,0);
      (*c->j->storei)(c,4,0,iVar17,iVar13,local_88);
      (*c->j->storei)(c,4,0,iVar17,iVar14,0);
      uVar24 = 4;
      do {
        (*c->j->set)(c,4,0,iVar17,(long)*(int *)((long)&local_b8.address + uVar24));
        (*c->j->storei)(c,4,0,iVar17,iVar14,uVar24);
        bVar27 = uVar24 < 0x14;
        uVar24 = uVar24 + 4;
      } while (bVar27);
      iVar18 = dill_getreg(c,8);
      iVar17 = dill_getreg(c,8);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar18,src_addr,local_90);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar17,dest_addr,dest_offset);
      dill_scallv(c,transpose_array,"transpose_array","%p%p%p%I%I%I%p",iVar13,iVar18,iVar17,uVar9,
                  FVar3,conv->dest_size,iVar14);
      return;
    }
    iVar18 = (conv->src_field).size;
    local_80 = (long)iVar18;
    iVar13 = 1;
    pFVar23 = type_desc;
    do {
      iVar13 = iVar13 * (pFVar23->static_size + (uint)(pFVar23->static_size == 0));
      pFVar23 = pFVar23->next;
    } while (pFVar23->type == FMType_array);
    if (((((data_already_copied != 0) && ((conv->src_field).byte_swap == '\0')) &&
         ((conv->src_field).src_float_format == (conv->src_field).target_float_format)) &&
        ((iVar18 == conv->dest_size && (conv->subconversion == (IOConversionPtr)0x0)))) &&
       (((pFVar23->type & ~FMType_string) != FMType_pointer &&
        ((conv->src_field).data_type != string_type)))) {
      return;
    }
    local_90 = src_offset;
    iVar18 = dill_getreg(c,8);
    iVar17 = dill_getreg(c,8);
    (*c->j->mov)(c,8,0,iVar18,src_addr);
    (*c->j->mov)(c,8,0,iVar17,dest_addr);
    iVar14 = dill_getreg(c,4);
    pjVar7 = c->j->a3i_data;
    local_88 = CONCAT44(local_88._4_4_,iVar18);
    (*c->j->jmp_a3i[0x28])(c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar18,iVar18,local_90)
    ;
    pjVar7 = c->j->a3i_data;
    (*c->j->jmp_a3i[0x28])
              (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar17,iVar17,dest_offset);
    uVar15 = dill_alloc_label(c,0);
    uVar24 = (ulong)uVar15;
    uVar12 = dill_alloc_label(c,0);
    local_90 = CONCAT44(local_90._4_4_,uVar12);
    (*c->j->set)(c,4,0,iVar14,(long)iVar13);
    FVar4 = type_desc->type;
    while (FVar4 == FMType_array) {
      if (type_desc->static_size == 0) {
        iVar18 = *(int *)&conv_status->control_value;
        iVar13 = type_desc->control_field_index;
        iVar16 = dill_getreg(c,4);
        (*c->j->loadi)(c,4,0,iVar16,iVar18,(long)iVar13 << 2);
        pjVar7 = c->j->a3_data;
        (*c->j->jmp_a3[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar14,iVar14,iVar16);
      }
      type_desc = type_desc->next;
      FVar4 = type_desc->type;
    }
    iVar18 = rt_conv_status;
    if (data_already_copied == 0) {
      sVar21 = decode_size_delta(conv_status,conv,(FMTypeDesc *)(ulong)FVar4);
      if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
        iVar18 = 0;
        switch(FVar4) {
        case FMType_pointer:
        case FMType_string:
          iVar18 = conv_status->src_pointer_size;
          break;
        case FMType_subformat:
          iVar18 = conv->subconversion->ioformat->body->record_length;
          break;
        case FMType_simple:
          iVar18 = (conv->src_field).size;
        }
        iVar13 = dill_getreg(c,4);
        pjVar7 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar13,iVar14,(long)iVar18);
        dill_scallv(c,memcpy,"memcpy","%p%p%i",iVar17,local_88 & 0xffffffff,iVar13);
      }
      iVar18 = rt_conv_status;
      if (sVar21 != 0) {
        iVar13 = dill_getreg(c,4);
        iVar16 = dill_getreg(c,4);
        pjVar7 = c->j->a3i_data;
        (*c->j->jmp_a3i[8])(c,(int)pjVar7[8].data1,(int)pjVar7[8].data2,iVar13,iVar14,sVar21);
        iVar18 = rt_conv_status;
        (*c->j->loadi)(c,8,0,iVar16,rt_conv_status,8);
        pjVar7 = c->j->a3_data;
        (*c->j->jmp_a3[0x28])
                  (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar16,iVar16,iVar13);
        (*c->j->storei)(c,8,0,iVar16,rt_conv_status,8);
      }
    }
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%P%p","format %s, field Initial loopvar = %x\n",
                  conv_status->global_conv->ioformat->body->format_name,iVar14);
    }
    pjVar7 = c->j->b_data;
    (*c->j->jmp_bi[0x25])(c,(int)pjVar7[0x25].data1,(int)pjVar7[0x25].data2,iVar14,0,(int)local_90);
    iVar13 = (int)uVar24;
    dill_mark_label(c,uVar24 & 0xffffffff);
    dVar29 = (int)local_88;
    generate_convert_field
              (c,conv_status,(int)local_88,0,iVar17,0,iVar18,conv,type_desc,data_already_copied);
    pjVar7 = c->j->a3i_data;
    (*c->j->jmp_a3i[4])(c,(int)pjVar7[4].data1,(int)pjVar7[4].data2,iVar14,iVar14,1);
    if (((conv->iovar->type_desc).type == FMType_pointer) &&
       (((conv->iovar->type_desc).next)->next->type == FMType_pointer)) {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,dVar29,dVar29,
                 (long)conv_status->src_pointer_size);
      pp_Var25 = c->j->jmp_a3i;
      pjVar7 = c->j->a3i_data;
      sVar1 = pjVar7[0x28].data1;
      sVar2 = pjVar7[0x28].data2;
      iVar18 = conv_status->target_pointer_size;
    }
    else {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,dVar29,dVar29,local_80);
      pp_Var25 = c->j->jmp_a3i;
      pjVar7 = c->j->a3i_data;
      sVar1 = pjVar7[0x28].data1;
      sVar2 = pjVar7[0x28].data2;
      iVar18 = conv->dest_size;
    }
    (*pp_Var25[0x28])(c,(int)sVar1,(int)sVar2,iVar17,iVar17,(long)iVar18);
    if (_debug_code_generation != 0) {
      dill_scallv(c,printf,"printf","%P%p%p%p","loopvar = %x, src %x, dest %x\n",iVar14,dVar29,
                  iVar17);
    }
    pjVar7 = c->j->b_data;
    (*c->j->jmp_bi[0x1a])(c,(int)pjVar7[0x1a].data1,(int)pjVar7[0x1a].data2,iVar14,0,iVar13);
    dill_mark_label(c,local_90 & 0xffffffff);
    return;
  case FMType_string:
    local_b8.size = (conv->src_field).size;
    local_b8._12_4_ = (conv->src_field).data_type;
    local_b8.offset._0_1_ = (conv->src_field).byte_swap;
    local_b8.offset._1_1_ = (conv->src_field).src_float_format;
    local_b8.offset._2_1_ = (conv->src_field).target_float_format;
    local_b8.offset._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    local_b8.address = 0;
    local_b8.data_type = unknown_type;
    uVar12 = dill_alloc_label(c,0);
    uVar28 = (undefined4)local_b8.offset;
    tmp_spec_00.size = local_b8.size;
    tmp_spec_00.offset._0_4_ = local_b8.address;
    tmp_spec_00.offset._4_4_ = local_b8.data_type;
    tmp_spec_00.data_type = local_b8._12_4_;
    tmp_spec_00.byte_swap = (char)uVar28;
    tmp_spec_00.src_float_format = (char)((uint)uVar28 >> 8);
    tmp_spec_00.target_float_format = (char)((uint)uVar28 >> 0x10);
    tmp_spec_00._19_1_ = (char)((uint)uVar28 >> 0x18);
    tmp_spec_00._20_4_ = (int)(local_b8.offset >> 0x20);
    gen_convert_address_field
              (c,tmp_spec_00,src_addr,(dill_reg)src_offset,(long)conv->dest_size,
               conv_status->src_offset_adjust,rt_conv_status,(size_t)&local_58,(size_t)&local_70,
               conv_status->register_args,CONCAT44(in_stack_ffffffffffffff1c,uVar12),
               (dill_reg *)CONCAT44(rt_conv_status,data_already_copied),(dill_reg *)dest_offset,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
    iVar18 = (int)local_70;
    if (data_already_copied == 0) {
      dill_scallv(c,strcpy,"strcpy","%p%p",local_70 & 0xffffffff,local_58.address);
    }
    dill_mark_label(c,uVar12);
    pjVar19 = c->j;
    iVar13 = 8;
    break;
  case FMType_subformat:
    pcVar20 = FFSTypeHandle_name(conv->subconversion->ioformat);
    if (conv->subconversion->conv_func == (conv_routine)0x0) {
      conv_status->global_conv->conv_pkg = (char *)0xffffffffffffffff;
    }
    iVar18 = conv_status->register_args;
    iVar13 = dill_getreg(c,8);
    iVar17 = dill_getreg(c,8);
    if (iVar18 == 0) {
      iVar18 = dill_getreg(c,8);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar13,src_addr,src_offset);
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar17,dest_addr,dest_offset);
      (*c->j->loadi)(c,8,0,iVar18,c->dill_local_pointer,(long)rt_conv_status);
      p_Var22 = conv->subconversion->conv_func;
    }
    else {
      pjVar7 = c->j->a3i_data;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar13,src_addr,src_offset);
      pjVar7 = c->j->a3i_data;
      iVar18 = rt_conv_status;
      (*c->j->jmp_a3i[0x28])
                (c,(int)pjVar7[0x28].data1,(int)pjVar7[0x28].data2,iVar17,dest_addr,dest_offset);
      p_Var22 = conv->subconversion->conv_func;
    }
    dill_scallp(c,p_Var22,pcVar20,"%p%p%p",iVar13,iVar17,iVar18);
    return;
  case FMType_simple:
    uVar15 = (conv->src_field).size;
    FVar3 = (conv->src_field).data_type;
    uVar5._0_1_ = (conv->src_field).byte_swap;
    uVar5._1_1_ = (conv->src_field).src_float_format;
    uVar5._2_1_ = (conv->src_field).target_float_format;
    uVar5._3_5_ = *(undefined5 *)&(conv->src_field).field_0x13;
    iVar18 = conv_status->global_conv->required_alignment;
    size = conv->dest_size;
    local_70 = 0;
    uStack_68 = uVar15;
    FStack_64 = FVar3;
    local_60 = uVar5;
    uVar10 = drisc_type((_FMgetFieldStruct *)(ulong)uVar15);
    uVar11 = drisc_type((_FMgetFieldStruct *)(ulong)size);
    piVar6 = c->j->type_align;
    iVar13 = piVar6[uVar10];
    uVar24 = (ulong)uVar11;
    iVar17 = piVar6[uVar24];
    if ((iVar18 < iVar13) || (src_offset % (ulong)(long)iVar13 != 0)) {
      iVar13 = 0;
    }
    else {
      iVar13 = 1;
    }
    if ((iVar18 < iVar17) || (dest_offset % (ulong)(long)iVar17 != 0)) {
      uVar12 = 0;
    }
    else {
      uVar12 = 1;
    }
    if (FVar3 != float_type) {
      local_88 = CONCAT44(local_88._4_4_,uVar12);
      gen_operand(&local_b8,src_addr,src_offset,uVar15,FVar3,iVar13,(uint)(byte)(undefined1)uVar5);
      if (local_b8.address != 0) {
        gen_load(c,&local_b8);
      }
      if (local_b8.data_type != FVar3) {
        src_oprnd.size = local_b8.size;
        src_oprnd.address = local_b8.address;
        src_oprnd.data_type = local_b8.data_type;
        src_oprnd._12_4_ = local_b8._12_4_;
        src_oprnd.offset._0_4_ = (int)local_b8.offset;
        src_oprnd.offset._4_4_ = (int)(local_b8.offset >> 0x20);
        src_oprnd.aligned = local_b8.aligned;
        src_oprnd.byte_swap = local_b8.byte_swap;
        src_oprnd.vc_reg = local_b8.vc_reg;
        src_oprnd.vc_reg2 = local_b8.vc_reg2;
        gen_type_conversion(&local_58,c,src_oprnd,FVar3);
        oprnd.size = local_b8.size;
        oprnd.address = local_b8.address;
        oprnd.data_type = local_b8.data_type;
        oprnd._12_4_ = local_b8._12_4_;
        oprnd.offset._0_4_ = (int)local_b8.offset;
        oprnd.offset._4_4_ = (int)(local_b8.offset >> 0x20);
        oprnd.aligned = local_b8.aligned;
        oprnd.byte_swap = local_b8.byte_swap;
        oprnd.vc_reg = local_b8.vc_reg;
        oprnd.vc_reg2 = local_b8.vc_reg2;
        free_oprnd(c,oprnd);
        local_b8.vc_reg = local_58.vc_reg;
        local_b8.vc_reg2 = local_58.vc_reg2;
        local_b8.data_type = local_58.data_type;
        local_b8.address = local_58.address;
        local_b8.offset = local_58.offset;
        local_b8.aligned = local_58.aligned;
        local_b8.byte_swap = local_58.byte_swap;
        local_b8.size = local_58.size;
        local_b8._12_4_ = local_58._12_4_;
      }
      if (local_b8.size != size) {
        src_oprnd_00.size = local_b8.size;
        src_oprnd_00.address = local_b8.address;
        src_oprnd_00.data_type = local_b8.data_type;
        src_oprnd_00._12_4_ = local_b8._12_4_;
        src_oprnd_00.offset._0_4_ = (int)local_b8.offset;
        src_oprnd_00.offset._4_4_ = (int)(local_b8.offset >> 0x20);
        src_oprnd_00.aligned = local_b8.aligned;
        src_oprnd_00.byte_swap = local_b8.byte_swap;
        src_oprnd_00.vc_reg = local_b8.vc_reg;
        src_oprnd_00.vc_reg2 = local_b8.vc_reg2;
        gen_size_conversion(&local_58,c,src_oprnd_00,size);
        oprnd_00.size = local_b8.size;
        oprnd_00.address = local_b8.address;
        oprnd_00.data_type = local_b8.data_type;
        oprnd_00._12_4_ = local_b8._12_4_;
        oprnd_00.offset._0_4_ = (int)local_b8.offset;
        oprnd_00.offset._4_4_ = (int)(local_b8.offset >> 0x20);
        oprnd_00.aligned = local_b8.aligned;
        oprnd_00.byte_swap = local_b8.byte_swap;
        oprnd_00.vc_reg = local_b8.vc_reg;
        oprnd_00.vc_reg2 = local_b8.vc_reg2;
        free_oprnd(c,oprnd_00);
        local_b8.vc_reg = local_58.vc_reg;
        local_b8.vc_reg2 = local_58.vc_reg2;
        local_b8.data_type = local_58.data_type;
        local_b8.address = local_58.address;
        local_b8.offset = local_58.offset;
        local_b8.aligned = local_58.aligned;
        local_b8.byte_swap = local_58.byte_swap;
        local_b8.size = local_58.size;
        local_b8._12_4_ = local_58._12_4_;
      }
      src_01.size = local_b8.size;
      src_01.address = local_b8.address;
      src_01.data_type = local_b8.data_type;
      src_01._12_4_ = local_b8._12_4_;
      src_01.offset._0_4_ = (int)local_b8.offset;
      src_01.offset._4_4_ = (int)(local_b8.offset >> 0x20);
      src_01.aligned = local_b8.aligned;
      src_01.byte_swap = local_b8.byte_swap;
      src_01.vc_reg = local_b8.vc_reg;
      src_01.vc_reg2 = local_b8.vc_reg2;
      gen_store(c,src_01,dest_addr,dest_offset,size,FVar3,(int)local_88);
      oprnd_01.size = local_b8.size;
      oprnd_01.address = local_b8.address;
      oprnd_01.data_type = local_b8.data_type;
      oprnd_01._12_4_ = local_b8._12_4_;
      oprnd_01.offset._0_4_ = (int)local_b8.offset;
      oprnd_01.offset._4_4_ = (int)(local_b8.offset >> 0x20);
      oprnd_01.aligned = local_b8.aligned;
      oprnd_01.byte_swap = local_b8.byte_swap;
      oprnd_01.vc_reg = local_b8.vc_reg;
      oprnd_01.vc_reg2 = local_b8.vc_reg2;
      free_oprnd(c,oprnd_01);
      return;
    }
    if (uVar15 == size) {
      uVar12 = (undefined4)local_60;
      src.size = uStack_68;
      src.offset = local_70;
      src.data_type = FStack_64;
      src.byte_swap = (char)uVar12;
      src.src_float_format = (char)((uint)uVar12 >> 8);
      src.target_float_format = (char)((uint)uVar12 >> 0x10);
      src._19_1_ = (char)((uint)uVar12 >> 0x18);
      src._20_4_ = (int)((ulong)local_60 >> 0x20);
      gen_mem_float_conv(c,src,src_addr,src_offset,iVar18,dest_addr,dest_offset,uVar15,
                         in_stack_ffffffffffffff08);
      return;
    }
    if ((uVar10 == 4) || (uVar11 == 4)) {
      puts("must do call to conversion subroutine");
      return;
    }
    iVar13 = dest_addr;
    iVar17 = dill_getvblock(c,c->j->type_size[uVar24]);
    dest_offset_00 = (size_t)iVar17;
    uVar12 = (undefined4)local_60;
    src_00.size = uStack_68;
    src_00.offset = local_70;
    src_00.data_type = FStack_64;
    src_00.byte_swap = (char)uVar12;
    src_00.src_float_format = (char)((uint)uVar12 >> 8);
    src_00.target_float_format = (char)((uint)uVar12 >> 0x10);
    src_00._19_1_ = (char)((uint)uVar12 >> 0x18);
    src_00._20_4_ = (int)((ulong)local_60 >> 0x20);
    gen_mem_float_conv(c,src_00,src_addr,src_offset,iVar18,c->dill_local_pointer,dest_offset_00,size
                       ,in_stack_ffffffffffffff08);
    iVar18 = dill_getreg(c,10);
    if (uVar24 == 9) {
      (*c->j->loadi)(c,9,0,iVar18,c->dill_local_pointer,dest_offset_00);
      (*c->j->convert)(c,9,10,iVar18,iVar18);
      pjVar19 = c->j;
      iVar13 = 10;
    }
    else {
      if (uVar11 != 10) {
        return;
      }
      (*c->j->loadi)(c,10,0,iVar18,c->dill_local_pointer,dest_offset_00);
      dest_addr = iVar13;
      (*c->j->convert)(c,10,9,iVar18,iVar18);
      pjVar19 = c->j;
      iVar13 = 9;
    }
    break;
  default:
    goto switchD_00112b89_default;
  }
  (*pjVar19->storei)(c,iVar13,0,iVar18,dest_addr,dest_offset);
switchD_00112b89_default:
  return;
}

Assistant:

static void
generate_convert_field(dill_stream c, ConvStatus conv_status, dill_reg src_addr,
		       size_t src_offset, dill_reg dest_addr, size_t dest_offset,
		       dill_reg rt_conv_status, IOconvFieldStruct *conv, FMTypeDesc *type_desc,
		       int data_already_copied)
{
    switch(type_desc->type) {
    case FMType_pointer: {
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	int null_target = dill_alloc_label(c, NULL);
	tmp_spec.offset = 0;
	tmp_spec.size = conv_status->src_pointer_size;
	
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv_status->target_pointer_size, 
				  dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	{
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    dill_reg tmp_src_reg, tmp_dest_reg;
	    ffs_getreg(c, &tmp_dest_reg, DILL_P, DILL_VAR);
	    ffs_getreg(c, &tmp_src_reg, DILL_P, DILL_VAR);
#endif
	    dill_movp(c, tmp_src_reg, actual_src_reg);
	    dill_movp(c, tmp_dest_reg, actual_dest_reg);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       actual_src_reg, actual_dest_reg));
	    ffs_putreg(c, actual_src_reg, DILL_P);
	    ffs_putreg(c, actual_dest_reg, DILL_P);
	    generate_convert_field(c, conv_status, tmp_src_reg, 0, 
				   tmp_dest_reg, 0, rt_conv_status,
				   conv, type_desc->next, conv_status->global_conv->conversion_type == direct_to_mem);
	    
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	dill_mark_label(c, null_target);
	
#ifdef VERBOSE
	dill_scallv(c, (void*)printf, "printf", "%P%p",
		    "storing POINTER value %p\n",actual_dest_reg);
#endif
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);

	break;
    }
    case FMType_string:{
	dill_reg actual_src_reg, actual_dest_reg;
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	int null_target = dill_alloc_label(c, NULL);
	gen_convert_address_field(c, tmp_spec, 0, src_addr, src_offset,
				  conv->dest_size, dest_addr, dest_offset, 
				  conv_status->src_offset_adjust, 
				  rt_conv_status,
				  decode_size_delta(conv_status, conv, type_desc),
				  &actual_src_reg, &actual_dest_reg, 
				  conv_status->register_args, null_target);
	/* generate strcpy */
	if (!data_already_copied) {
#ifdef VERBOSE
	    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
			"Calling Strcpy with args %p, %p\n",actual_dest_reg, actual_src_reg);

#endif
	    dill_scallv(c, (void*)strcpy, "strcpy", "%p%p", actual_dest_reg, actual_src_reg);

	}
	dill_mark_label(c, null_target);
	
	dill_stpi(c, actual_dest_reg, dest_addr, dest_offset);
	REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		   actual_src_reg, actual_dest_reg));
	ffs_putreg(c, actual_src_reg, DILL_P);
	ffs_putreg(c, actual_dest_reg, DILL_P);
	break;
    }
    case FMType_subformat: {
	FFSTypeHandle subformat = conv->subconversion->ioformat;
	char *name = FFSTypeHandle_name(subformat);
	if (conv->subconversion->conv_func == NULL) {
	    /* we're not linking to an address that's valid, 
	       must fill it in later */
	    conv_status->global_conv->conv_pkg = (char *) -1;
	}
	    
	if (conv_status->register_args) {
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    (void) dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			      new_dest, rt_conv_status);
	    REG_DEBUG(("Putting %d and %d for new src & dest\n", 
		       new_src, new_dest));
	    if (debug_code_generation()) {
/*	        VCALL2V(printf, "%P%p",
	    "After subroutine call, new src_string_base is %p\n", src_string_base);*/
	    }
	    ffs_putreg(c, new_src, DILL_P);
	    ffs_putreg(c, new_dest, DILL_P);
	} else {
	    dill_reg reg_rt_conv_status;
	    dill_reg new_src, new_dest;
	    if (!ffs_getreg(c, &new_src, DILL_P, DILL_TEMP) ||
		!ffs_getreg(c, &new_dest, DILL_P, DILL_TEMP))
		gen_fatal("temp vals in subcall\n");
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#endif

	    if (!ffs_getreg(c, &reg_rt_conv_status, DILL_P, DILL_TEMP))
		gen_fatal("temp string vals in subcall\n");
	    REG_DEBUG(("Getting %d and %d for reg_rt_conv_status\n", reg_rt_conv_status));
	    dill_addpi(c, new_src, src_addr, src_offset);
	    dill_addpi(c, new_dest, dest_addr, dest_offset);
	    dill_ldpi(c, reg_rt_conv_status, dill_lp(c), rt_conv_status);
	    dill_scallp(c, (void*)conv->subconversion->conv_func, name, "%p%p%p", new_src,
			new_dest, reg_rt_conv_status);
	    REG_DEBUG(("Putting %d reg_rt_conv_status\n", reg_rt_conv_status));
	    ffs_putreg(c, reg_rt_conv_status, DILL_P);
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	}
	break;
    }
    case FMType_simple: {
	struct _FMgetFieldStruct tmp_spec = conv->src_field;
	tmp_spec.offset = 0;
	gen_simple_field_conv(c, tmp_spec, 
			      conv_status->global_conv->required_alignment, 
			      src_addr, src_offset, 
			      conv->dest_size, tmp_spec.data_type, 
			      dest_addr, dest_offset);
	break;
    }
    case FMType_array:
	if (conv->rc_swap == no_row_column_swap) {
	    int static_elements = 1;
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    FMTypeDesc *next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    static_elements *= next->static_size;
		}
		next = next->next;
	    }
	
	    dill_reg loop_var;
	    int loop_var_type;

	    int loop_head, loop_end;
	    if (data_already_copied &&
		!conv->src_field.byte_swap &&
		(conv->src_field.src_float_format == conv->src_field.target_float_format) &&
		(conv->src_field.size == conv->dest_size) &&
		(conv->subconversion == NULL) &&
		(next->type != FMType_pointer) &&
		(next->type != FMType_string) &&
		((conv->src_field.data_type != string_type))) {
		/* Nothing but data movement required */
		    break;
	    }
#ifdef RAW
	    int src_storage = ffs_local(c, DILL_P);
	    int dest_storage = ffs_local(c, DILL_P);
	    int loop_storage = 0;

	    /* save values of src_addr and dest_addr */
	    dill_stpi(c, src_addr, dill_lp(c), src_storage);
	    dill_stpi(c, dest_addr, dill_lp(c), dest_storage);
#else
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_movp(c, tmp_src, src_addr);
		dill_movp(c, tmp_dest, dest_addr);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
#endif

	    if (((conv->subconversion == NULL)) &&
		!debug_code_generation()) {
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_TEMP))
		    gen_fatal("gen field convert out of registers BB \n");
		loop_var_type = DILL_TEMP;
	    } else {
		/* may call a subconversion in here, use VARs */
		if (!ffs_getreg(c, &loop_var, DILL_I, DILL_VAR))
		    gen_fatal("gen field convert out of registers CC\n");
		loop_var_type = DILL_VAR;
	    }
	    REG_DEBUG(("Getting1 %d as loop_var\n", _vrr(loop_var)));
	    dill_addpi(c, src_addr, src_addr, src_offset);
	    dill_addpi(c, dest_addr, dest_addr, dest_offset);

	    /* gen conversion loop */
	    loop_head = dill_alloc_label(c, NULL);
	    loop_end = dill_alloc_label(c, NULL);
	    dill_seti(c, loop_var, static_elements);
	    next = type_desc;
	    while (next->type == FMType_array) {
		if (next->static_size == 0) {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    dill_reg val;
		    int field = next->control_field_index;
		    ffs_getreg(c, &val, DILL_I, DILL_TEMP);
		    dill_ldii(c, val, addr_reg, field*sizeof(int));
		    dill_muli(c, loop_var, loop_var, val);
		}
		next = next->next;
	    }
	    if (!data_already_copied) {
		ssize_t base_delta = decode_size_delta(conv_status, conv, next);
		if (conv_status->global_conv->conversion_type == copy_dynamic_portion) {
		    int base_size = item_size(conv_status, conv, next);
		    dill_reg size;
		    ffs_getreg(c, &size, DILL_I, DILL_TEMP);
		    dill_mulii(c, size, loop_var, base_size);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p%p",
				"Calling Memcpy with args %p, %p, %d\n",dest_addr, src_addr, size);
#endif
		    dill_scallv(c, (void*)memcpy, "memcpy", "%p%p%i",
				dest_addr, src_addr, size);
		}
		if (base_delta != 0) {
		    dill_reg dest_src_ptr, delta;
		    ffs_getreg(c, &delta, DILL_I, DILL_TEMP);
		    ffs_getreg(c, &dest_src_ptr, DILL_I, DILL_TEMP);
		    dill_mulii(c, delta, loop_var, base_delta);
#ifdef VERBOSE
		    dill_scallv(c, (void*)printf, "printf", "%P%p",
				"Adjusting dest_pointer_base by %p\n", delta);
#endif
		    dill_ldpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		    dill_addp(c, dest_src_ptr, dest_src_ptr, delta);
		    dill_stpi(c, dest_src_ptr, rt_conv_status, FMOffset(RTConvStatus,dest_pointer_base));
		}
	    }

	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%P%p",
			    "format %s, field Initial loopvar = %x\n", conv_status->global_conv->ioformat->body->format_name, loop_var);
	    }
	    
	    dill_bleii(c, loop_var, 0, loop_end);
	    dill_mark_label(c, loop_head);
#if defined(NOT) & defined(RAW)
	    if (!register_args) {
		/* store away loop var and free the reg */
		loop_storage = ffs_local(c, DILL_I);
		dill_stii(c, loop_var, dill_lp(c), loop_storage);
		REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
		ffs_putreg(c, loop_var, DILL_I);
	    }
#endif
	    generate_convert_field(c, conv_status, src_addr, 0, dest_addr, 0, 
				   rt_conv_status, conv, next, 
				   data_already_copied);
	    
	    (void)loop_var_type;  /* avoid warning */
#if defined(NOT) & defined(RAW)
	    /* generate end of loop */
	    if (!register_args) {
		/* store away loop var and free the reg */
		ffs_getreg(c, &loop_var, DILL_I, loop_var_type);
		REG_DEBUG(("Getting %d as loop_var\n", _vrr(loop_var)));
		dill_ldii(c, loop_var, dill_lp(c), loop_storage);
	    }
#endif
	    dill_subii(c, loop_var, loop_var, 1);
	    int array_of_pointers = 0;
	    if (conv->iovar->type_desc.type == FMType_pointer) {
		array_of_pointers = (conv->iovar->type_desc.next->next->type == FMType_pointer);
	    }
	    if (array_of_pointers) {
		dill_addpi(c, src_addr, src_addr, conv_status->src_pointer_size);
		dill_addpi(c, dest_addr, dest_addr, conv_status->target_pointer_size);
	    } else {
		dill_addpi(c, src_addr, src_addr, tmp_spec.size);
		dill_addpi(c, dest_addr, dest_addr, conv->dest_size);
	    }		
	    if (debug_code_generation()) {
		dill_scallv(c, (void*)printf, "printf", "%P%p%p%p",
			    "loopvar = %x, src %x, dest %x\n", loop_var,
			    src_addr, dest_addr);
	    }
	    dill_bgtii(c, loop_var, 0, loop_head);
	    dill_mark_label(c, loop_end);
	    ffs_putreg(c, loop_var, DILL_I);
	    REG_DEBUG(("Putting %d as loop_var\n", _vrr(loop_var)));
	
	    /* restore values of src_addr and dest_addr */
#ifdef RAW
	    dill_ldpi(c, src_addr, dill_lp(c), src_storage);
	    dill_ldpi(c, dest_addr, dill_lp(c), dest_storage);
#endif
	} else {
	    /* generate a call to transpose */
	    struct _FMgetFieldStruct tmp_spec = conv->src_field;
	    dill_reg dimens, dimen_reg, spec, spec_reg, tmp;
	    int source_column_major = 
		(conv->rc_swap == swap_source_column_major);
	    int dimen_count = conv->iovar->dimen_count;
	    FMdata_type dest_type = conv->src_field.data_type;

	    ffs_getreg(c, &dimen_reg, DILL_P, DILL_TEMP);
	    ffs_getreg(c, &tmp, DILL_I, DILL_TEMP);
	    ffs_getreg(c, &spec_reg, DILL_P, DILL_TEMP);
	    dimens = ffs_localb(c, dimen_count * sizeof(int));
	    spec = ffs_localb(c, sizeof(struct _FMgetFieldStruct));
	    dill_virtual_lea(c, dimen_reg, dimens);
	    dill_virtual_lea(c, spec_reg, spec);
	    FMTypeDesc *next = type_desc;
	    int i = 0;
	    while (next->type == FMType_array) {
		if (next->static_size != 0) {
		    dill_seti(c, tmp, next->static_size);
		} else {
		    dill_reg addr_reg = (dill_reg)(intptr_t)conv_status->control_value;
		    int field = next->control_field_index;
		    dill_ldii(c, tmp, addr_reg, field*sizeof(int));
		}
		dill_stii(c, tmp, dimen_reg, i * sizeof(int));
		i++;
		next = next->next;
	    }
	    dill_seti(c, tmp, 0);
	    dill_stii(c, tmp, dimen_reg, dimen_count * sizeof(int));
	    dill_stii(c, tmp, spec_reg, FMOffset(struct _IOgetFieldStruct *, offset));
	    for (i=4 ; i < sizeof(struct _IOgetFieldStruct); i+= 4) {
		dill_seti(c, tmp, *((int*)((char*)&tmp_spec + i)));
		dill_stii(c, tmp, spec_reg, i);
	    }
	    {
		dill_reg tmp_src, tmp_dest;
		ffs_getreg(c, &tmp_src, DILL_P,DILL_TEMP);
		ffs_getreg(c, &tmp_dest, DILL_P,DILL_TEMP);
		dill_addpi(c, tmp_src, src_addr, src_offset);
		dill_addpi(c, tmp_dest, dest_addr, dest_offset);
		src_addr = tmp_src;
		dest_addr = tmp_dest;
	    }
	    dill_scallv(c, (void*)transpose_array, "transpose_array",
			"%p%p%p%I%I%I%p", dimen_reg, src_addr, dest_addr,
			source_column_major, dest_type, conv->dest_size, spec_reg);
	}
	break;
    }
}